

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O3

void __thiscall OnDiskDataset::OnDiskDataset(OnDiskDataset *this,path *db_base,string *fname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  value_t vVar4;
  pointer pcVar5;
  undefined8 uVar6;
  bool bVar7;
  reference pbVar8;
  reference pvVar9;
  size_type sVar10;
  json j;
  iterator __begin1;
  string files_fname;
  string cache_fname;
  ifstream in;
  undefined1 local_358 [8];
  json_value local_350;
  path *local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  path *local_318;
  path local_310;
  path local_2d0;
  optional<OnDiskFileIndex> *local_290;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_288;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *local_280;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  istream local_238 [520];
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = (fname->_M_dataplus)._M_p;
  paVar2 = &fname->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar2) {
    uVar6 = *(undefined8 *)((long)&fname->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar6;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar5;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = fname->_M_string_length;
  (fname->_M_dataplus)._M_p = (pointer)paVar2;
  fname->_M_string_length = 0;
  (fname->field_2)._M_local_buf[0] = '\0';
  local_318 = db_base;
  std::experimental::filesystem::v1::__cxx11::path::path(&this->db_base,db_base);
  local_290 = &this->files_index;
  (this->files_index).super__Optional_base<OnDiskFileIndex,_false,_false>._M_payload.
  super__Optional_payload<OnDiskFileIndex,_true,_false,_false>.
  super__Optional_payload_base<OnDiskFileIndex>._M_engaged = false;
  local_280 = &this->indices;
  (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->taints;
  p_Var3 = &(this->taints)._M_t._M_impl.super__Rb_tree_header;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->taints)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (&local_2d0,&this->name);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_310,local_318);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_310,&local_2d0._M_pathname);
  std::ifstream::ifstream(local_238,local_310._M_pathname._M_dataplus._M_p,_S_bin);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_310);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2d0);
  local_358[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x0;
  local_350.object = (object_t *)0x0;
  nlohmann::operator>>
            (local_238,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_358);
  local_338._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)local_358,"indices");
  local_338._M_string_length = 0;
  local_338.field_2._M_allocated_capacity = 0;
  local_338.field_2._8_8_ = -0x8000000000000000;
  vVar4 = ((reference)local_338._M_dataplus._M_p)->m_type;
  if (vVar4 == null) {
    local_338.field_2._8_8_ = 1;
LAB_00133b68:
    local_278.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_278.m_it.array_iterator._M_current = (pointer)0x0;
    local_278.m_it.primitive_iterator.m_it = 1;
  }
  else if (vVar4 == array) {
    local_338.field_2._M_allocated_capacity =
         (size_type)
         (((((reference)local_338._M_dataplus._M_p)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_278.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_278.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_278.m_it.array_iterator._M_current =
         (((((reference)local_338._M_dataplus._M_p)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (vVar4 != object) {
      local_338.field_2._8_8_ = 0;
      goto LAB_00133b68;
    }
    local_338._M_string_length =
         (size_type)
         (((((reference)local_338._M_dataplus._M_p)->m_value).object)->_M_t)._M_impl.
         super__Rb_tree_header._M_header._M_left;
    local_278.m_it.array_iterator._M_current = (pointer)0x0;
    local_278.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_278.m_it.object_iterator._M_node =
         &(((((reference)local_338._M_dataplus._M_p)->m_value).object)->_M_t)._M_impl.
          super__Rb_tree_header._M_header;
  }
  local_348 = &this->db_base;
  local_340 = paVar1;
  local_278.m_object = (pointer)local_338._M_dataplus._M_p;
  while( true ) {
    bVar7 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_338,&local_278);
    if (bVar7) break;
    pbVar8 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_338);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_258,pbVar8);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (&local_2d0,&local_258);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_310,local_318);
    std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_310,&local_2d0._M_pathname);
    std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::
    emplace_back<std::experimental::filesystem::v1::__cxx11::path>(local_280,&local_310);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_310);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if (*local_338._M_dataplus._M_p == '\x02') {
      local_338.field_2._M_allocated_capacity = local_338.field_2._M_allocated_capacity + 0x10;
    }
    else if (*local_338._M_dataplus._M_p == '\x01') {
      local_338._M_string_length =
           std::_Rb_tree_increment((_Rb_tree_node_base *)local_338._M_string_length);
    }
    else {
      local_338.field_2._8_8_ = local_338.field_2._8_8_ + 1;
    }
  }
  local_310._M_pathname._M_dataplus._M_p =
       (pointer)nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)local_358,"taints");
  local_310._M_pathname._M_string_length = 0;
  local_310._M_pathname.field_2._M_allocated_capacity = 0;
  local_310._M_pathname.field_2._8_8_ = -0x8000000000000000;
  vVar4 = ((reference)local_310._M_pathname._M_dataplus._M_p)->m_type;
  if (vVar4 == null) {
    local_310._M_pathname.field_2._8_8_ = 1;
LAB_00133d4a:
    local_2d0._M_pathname._M_string_length = 0;
    local_2d0._M_pathname.field_2._M_allocated_capacity = 0;
    local_2d0._M_pathname.field_2._8_8_ = 1;
  }
  else if (vVar4 == array) {
    local_310._M_pathname.field_2._M_allocated_capacity =
         (size_type)
         (((((reference)local_310._M_pathname._M_dataplus._M_p)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_2d0._M_pathname._M_string_length = 0;
    local_2d0._M_pathname.field_2._8_8_ = 0x8000000000000000;
    local_2d0._M_pathname.field_2._M_allocated_capacity =
         (size_type)
         (((((reference)local_310._M_pathname._M_dataplus._M_p)->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (vVar4 != object) {
      local_310._M_pathname.field_2._8_8_ = 0;
      goto LAB_00133d4a;
    }
    local_310._M_pathname._M_string_length =
         (size_type)
         (((((reference)local_310._M_pathname._M_dataplus._M_p)->m_value).object)->_M_t)._M_impl.
         super__Rb_tree_header._M_header._M_left;
    local_2d0._M_pathname.field_2._M_allocated_capacity = 0;
    local_2d0._M_pathname.field_2._8_8_ = 0x8000000000000000;
    local_2d0._M_pathname._M_string_length =
         (size_type)
         &(((((reference)local_310._M_pathname._M_dataplus._M_p)->m_value).object)->_M_t)._M_impl.
          super__Rb_tree_header;
  }
  paVar1 = &local_338.field_2;
  local_2d0._M_pathname._M_dataplus._M_p = local_310._M_pathname._M_dataplus._M_p;
  while( true ) {
    bVar7 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_310,
                         (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_2d0);
    if (bVar7) break;
    pbVar8 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)&local_310);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_338,pbVar8);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>(local_288,&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != paVar1) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if (*local_310._M_pathname._M_dataplus._M_p == '\x02') {
      local_310._M_pathname.field_2._M_allocated_capacity =
           local_310._M_pathname.field_2._M_allocated_capacity + 0x10;
    }
    else if (*local_310._M_pathname._M_dataplus._M_p == '\x01') {
      local_310._M_pathname._M_string_length =
           std::_Rb_tree_increment((_Rb_tree_node_base *)local_310._M_pathname._M_string_length);
    }
    else {
      local_310._M_pathname.field_2._8_8_ = local_310._M_pathname.field_2._8_8_ + 1;
    }
  }
  pvVar9 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_358,"files");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_310._M_pathname,pvVar9);
  paVar2 = &local_2d0._M_pathname.field_2;
  local_2d0._M_pathname._M_string_length = 0;
  local_2d0._M_pathname.field_2._M_allocated_capacity =
       local_2d0._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_2d0._M_pathname._M_dataplus._M_p = (pointer)paVar2;
  if (local_358[0] ==
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       )0x1) {
    sVar10 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
             ::_M_count_tr<char[15],void>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                         *)local_350.object,(char (*) [15])"filename_cache");
    if (sVar10 != 0) {
      pvVar9 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_358,"filename_cache");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_338,pvVar9);
      std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != paVar1) {
        operator_delete(local_338._M_dataplus._M_p,
                        (ulong)(local_338.field_2._M_allocated_capacity + 1));
      }
      bVar7 = false;
      goto LAB_00133ed9;
    }
  }
  std::operator+(&local_338,"namecache.",&local_310._M_pathname);
  std::__cxx11::string::operator=((string *)&local_2d0,(string *)&local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar1) {
    operator_delete(local_338._M_dataplus._M_p,(ulong)(local_338.field_2._M_allocated_capacity + 1))
    ;
  }
  bVar7 = true;
LAB_00133ed9:
  std::optional<OnDiskFileIndex>::
  emplace<std::experimental::filesystem::v1::__cxx11::path_const&,std::__cxx11::string&,std::__cxx11::string&>
            (local_290,local_318,&local_310._M_pathname,&local_2d0._M_pathname);
  if (bVar7) {
    save(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_pathname._M_dataplus._M_p,
                    local_2d0._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_pathname._M_dataplus._M_p != &local_310._M_pathname.field_2) {
    operator_delete(local_310._M_pathname._M_dataplus._M_p,
                    (ulong)(local_310._M_pathname.field_2._M_allocated_capacity + 1));
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_358 + 8),(value_t)local_358[0]);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

OnDiskDataset::OnDiskDataset(const fs::path &db_base, std::string fname)
    : name(std::move(fname)), db_base(db_base) {
    std::ifstream in(db_base / name, std::ifstream::binary);
    json j;
    in >> j;

    for (const std::string &index_fname : j["indices"]) {
        indices.emplace_back(db_base / index_fname);
    }

    for (const std::string &taint : j["taints"]) {
        taints.insert(taint);
    }

    std::string files_fname = j["files"];
    bool needs_save = false;
    std::string cache_fname;
    if (j.count("filename_cache") > 0) {
        cache_fname = j["filename_cache"];
    } else {
        cache_fname = "namecache." + files_fname;
        needs_save = true;
    }

    files_index.emplace(db_base, files_fname, cache_fname);

    if (needs_save) {
        save();
    }
}